

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O2

int aesctr_setup_crypto(ptls_cipher_context_t *_ctx,int is_enc,void *key,size_t key_size)

{
  int extraout_EAX;
  undefined4 in_register_00000034;
  aesctr_context_t *ctx;
  
  _ctx->do_dispose = aesctr_dispose;
  _ctx->do_init = aesctr_init;
  _ctx->do_transform = aesctr_transform;
  cf_aes_init((cf_aes_context *)(_ctx + 1),(uint8_t *)CONCAT44(in_register_00000034,is_enc),
              (size_t)key);
  return extraout_EAX;
}

Assistant:

static int aesctr_setup_crypto(ptls_cipher_context_t *_ctx, int is_enc, const void *key, size_t key_size)
{
    struct aesctr_context_t *ctx = (struct aesctr_context_t *)_ctx;
    ctx->super.do_dispose = aesctr_dispose;
    ctx->super.do_init = aesctr_init;
    ctx->super.do_transform = aesctr_transform;
    cf_aes_init(&ctx->aes, key, key_size);
    return 0;
}